

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

int __thiscall OPLmusicFile::PlayTick(OPLmusicFile *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  BYTE *pBVar6;
  byte *pbVar7;
  OPLio *pOVar8;
  bool bVar9;
  byte bVar10;
  int which;
  BYTE code;
  BYTE long_delay_code;
  BYTE short_delay_code;
  BYTE to_reg_size;
  BYTE *to_reg;
  int delay_1;
  WORD delay;
  BYTE data;
  BYTE reg;
  OPLmusicFile *this_local;
  
  switch(this->RawPlayer) {
  case RDosPlay:
    while ((this->super_OPLmusicBlock).super_musicBlock.score <
           (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen) {
      pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
      bVar1 = *pbVar7;
      pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
      bVar2 = *pbVar7;
      if (bVar2 == 0) {
        if (bVar1 != 0) {
          return (uint)bVar1;
        }
      }
      else if (bVar2 == 2) {
        if (bVar1 == 0) {
          (this->super_OPLmusicBlock).SamplesPerTick =
               (double)*(ushort *)(this->super_OPLmusicBlock).super_musicBlock.score / 24.0;
          (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])
                    ((this->super_OPLmusicBlock).SamplesPerTick);
          (this->super_OPLmusicBlock).super_musicBlock.score =
               (this->super_OPLmusicBlock).super_musicBlock.score + 2;
        }
        else if (bVar1 == 1) {
          this->WhichChip = 0;
        }
        else if (bVar1 == 2) {
          this->WhichChip = 1;
        }
      }
      else if (bVar2 == 0xff) {
        if (bVar1 == 0xff) {
          return 0;
        }
      }
      else {
        pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
        (*pOVar8->_vptr_OPLio[4])(pOVar8,(ulong)(uint)this->WhichChip,(ulong)bVar2,(ulong)bVar1);
      }
    }
    break;
  case IMF:
    to_reg._4_2_ = 0;
    while( true ) {
      bVar9 = false;
      if (to_reg._4_2_ == 0) {
        bVar9 = (long)((this->super_OPLmusicBlock).super_musicBlock.score +
                      (4 - (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata)) <=
                (long)this->ScoreLen;
      }
      if (!bVar9) break;
      if (*(int *)(this->super_OPLmusicBlock).super_musicBlock.score == -1) {
        return 0;
      }
      bVar1 = *(this->super_OPLmusicBlock).super_musicBlock.score;
      bVar2 = (this->super_OPLmusicBlock).super_musicBlock.score[1];
      to_reg._4_2_ = *(ushort *)((this->super_OPLmusicBlock).super_musicBlock.score + 2);
      (this->super_OPLmusicBlock).super_musicBlock.score =
           (this->super_OPLmusicBlock).super_musicBlock.score + 4;
      pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
      (*pOVar8->_vptr_OPLio[4])(pOVar8,0,(ulong)bVar1,(ulong)bVar2);
    }
    return (uint)to_reg._4_2_;
  case DosBox1:
    while ((this->super_OPLmusicBlock).super_musicBlock.score <
           (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen) {
      pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
      to_reg._7_1_ = *pbVar7;
      if (to_reg._7_1_ == 4) {
        pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
        to_reg._7_1_ = *pbVar7;
        pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
        to_reg._6_1_ = *pbVar7;
LAB_0040c1fb:
        pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
        (*pOVar8->_vptr_OPLio[4])
                  (pOVar8,(ulong)(uint)this->WhichChip,(ulong)to_reg._7_1_,(ulong)to_reg._6_1_);
      }
      else {
        if (to_reg._7_1_ == 0) {
          pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
          return *pbVar7 + 1;
        }
        if (to_reg._7_1_ == 1) {
          bVar1 = *(this->super_OPLmusicBlock).super_musicBlock.score;
          bVar2 = (this->super_OPLmusicBlock).super_musicBlock.score[1];
          (this->super_OPLmusicBlock).super_musicBlock.score =
               (this->super_OPLmusicBlock).super_musicBlock.score + 2;
          return (uint)bVar1 + (uint)bVar2 * 0x100 + 1;
        }
        if (to_reg._7_1_ == 2) {
          this->WhichChip = 0;
        }
        else {
          if (to_reg._7_1_ != 3) {
            pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
            (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
            to_reg._6_1_ = *pbVar7;
            goto LAB_0040c1fb;
          }
          this->WhichChip = 1;
        }
      }
    }
    break;
  case DosBox2:
    pBVar6 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    bVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata[0x19];
    bVar2 = (this->super_OPLmusicBlock).super_musicBlock.scoredata[0x17];
    bVar3 = (this->super_OPLmusicBlock).super_musicBlock.scoredata[0x18];
    while ((this->super_OPLmusicBlock).super_musicBlock.score <
           (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen) {
      pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
      bVar4 = *pbVar7;
      pbVar7 = (this->super_OPLmusicBlock).super_musicBlock.score;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar7 + 1;
      bVar5 = *pbVar7;
      bVar10 = bVar4 & 0x7f;
      if (bVar10 == bVar2) {
        return bVar5 + 1;
      }
      if (bVar10 == bVar3) {
        return (bVar5 + 1) * 0x100;
      }
      if (bVar10 < bVar1) {
        pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
        (*pOVar8->_vptr_OPLio[4])
                  (pOVar8,(ulong)((bVar4 & 0x80) != 0),(ulong)pBVar6[(ulong)bVar10 + 0x1a],
                   (ulong)bVar5);
      }
    }
  }
  return 0;
}

Assistant:

int OPLmusicFile::PlayTick ()
{
	BYTE reg, data;
	WORD delay;

	switch (RawPlayer)
	{
	case RDosPlay:
		while (score < scoredata + ScoreLen)
		{
			data = *score++;
			reg = *score++;
			switch (reg)
			{
			case 0:		// Delay
				if (data != 0)
				{
					return data;
				}
				break;

			case 2:		// Speed change or OPL3 switch
				if (data == 0)
				{
					SamplesPerTick = LittleShort(*(WORD *)(score)) / ADLIB_CLOCK_MUL;
					io->SetClockRate(SamplesPerTick);
					score += 2;
				}
				else if (data == 1)
				{
					WhichChip = 0;
				}
				else if (data == 2)
				{
					WhichChip = 1;
				}
				break;

			case 0xFF:	// End of song
				if (data == 0xFF)
				{
					return 0;
				}
				break;

			default:	// It's something to stuff into the OPL chip
				io->OPLwriteReg(WhichChip, reg, data);
				break;
			}
		}
		break;

	case DosBox1:
		while (score < scoredata + ScoreLen)
		{
			reg = *score++;

			if (reg == 4)
			{
				reg = *score++;
				data = *score++;
			}
			else if (reg == 0)
			{ // One-byte delay
				return *score++ + 1;
			}
			else if (reg == 1)
			{ // Two-byte delay
				int delay = score[0] + (score[1] << 8) + 1;
				score += 2;
				return delay;
			}
			else if (reg == 2)
			{ // Select OPL chip 0
				WhichChip = 0;
				continue;
			}
			else if (reg == 3)
			{ // Select OPL chip 1
				WhichChip = 1;
				continue;
			}
			else
			{
				data = *score++;
			}
			io->OPLwriteReg(WhichChip, reg, data);
		}
		break;

	case DosBox2:
		{
			BYTE *to_reg = scoredata + 0x1A;
			BYTE to_reg_size = scoredata[0x19];
			BYTE short_delay_code = scoredata[0x17];
			BYTE long_delay_code = scoredata[0x18];

			while (score < scoredata + ScoreLen)
			{
				BYTE code = *score++;
				data = *score++;

				// Which OPL chip to write to is encoded in the high bit of the code value.
				int which = !!(code & 0x80);
				code &= 0x7F;

				if (code == short_delay_code)
				{
					return data + 1;
				}
				else if (code == long_delay_code)
				{
					return (data + 1) << 8;
				}
				else if (code < to_reg_size)
				{
					io->OPLwriteReg(which, to_reg[code], data);
				}
			}
		}
		break;

	case IMF:
		delay = 0;
		while (delay == 0 && score + 4 - scoredata <= ScoreLen)
		{
			if (*(DWORD *)score == 0xFFFFFFFF)
			{ // This is a special value that means to end the song.
				return 0;
			}
			reg = score[0];
			data = score[1];
			delay = LittleShort(((WORD *)score)[1]);
			score += 4;
			io->OPLwriteReg (0, reg, data);
		}
		return delay;
	}
	return 0;
}